

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::
Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::
erase<std::__cxx11::string>
          (Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  iterator pos;
  bool bVar1;
  iterator local_80;
  Node *local_68;
  Node *local_60;
  InnerMap *local_58;
  iterator local_50;
  undefined1 local_38 [8];
  iterator it;
  key_arg<std::__cxx11::basic_string<char>_> *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find<std::__cxx11::string>((iterator *)local_38,this,key);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  ::end(&local_50,
        (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
         *)this);
  bVar1 = protobuf::operator==((iterator *)local_38,&local_50);
  if (!bVar1) {
    local_68 = (Node *)local_38;
    local_60 = it.it_.node_;
    local_58 = it.it_.m_;
    pos.it_.m_ = (InnerMap *)it.it_.node_;
    pos.it_.node_ = (Node *)local_38;
    pos.it_.bucket_index_ = (size_type)it.it_.m_;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
    ::erase(&local_80,
            (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
             *)this,pos);
  }
  this_local = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                *)(ulong)!bVar1;
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_arg<K>& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }